

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O3

void __thiscall Spi::flash_wait(Spi *this)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  uint8_t data [2];
  ushort local_3a;
  timespec local_38;
  
  if (this->verbose == true) {
    flash_wait();
  }
  iVar4 = 0;
  do {
    local_3a = 5;
    set_gpio(this,0,0);
    xfer_spi(this,(uint8_t *)&local_3a,2);
    set_gpio(this,1,0);
    if ((local_3a & 0x100) == 0) {
      if (1 < iVar4) {
        bVar1 = this->verbose;
        if ((bool)bVar1 == true) {
          fputc(0x52,_stderr);
          fflush(_stderr);
          bVar1 = this->verbose;
        }
        if ((bVar1 & 1) != 0) {
          fputc(10,_stderr);
        }
        return;
      }
      iVar4 = iVar4 + 1;
      iVar2 = 0x72;
      if (this->verbose != false) {
LAB_001152ac:
        fputc(iVar2,_stderr);
        fflush(_stderr);
      }
    }
    else {
      iVar4 = 0;
      iVar2 = 0x2e;
      if (this->verbose == true) goto LAB_001152ac;
    }
    local_38.tv_sec = 0;
    local_38.tv_nsec = 1000000;
    do {
      iVar2 = nanosleep(&local_38,&local_38);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  } while( true );
}

Assistant:

void Spi::flash_wait() {
	if (verbose)
		fprintf(stderr, "waiting..");

	int count = 0;
	while (1) {
		uint8_t data[2] = { FC_RSR1 };

		flash_chip_select();
		xfer_spi(data, 2);
		flash_chip_deselect();

		if ((data[1] & 0x01) == 0) {
			if (count < 2) {
				count++;
				if (verbose) {
					fprintf(stderr, "r");
					fflush(stderr);
				}
			} else {
				if (verbose) {
					fprintf(stderr, "R");
					fflush(stderr);
				}
				break;
			}
		} else {
			if (verbose) {
				fprintf(stderr, ".");
				fflush(stderr);
			}
			count = 0;
		}

		std::this_thread::sleep_for(std::chrono::milliseconds(1));
	}

	if (verbose)
		fprintf(stderr, "\n");

}